

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

int uv__async_start(uv_loop_t *loop)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  int pipefd [2];
  char buf [32];
  uint local_40;
  uint local_3c;
  char local_38 [32];
  
  if ((loop->async_io_watcher).fd != -1) {
    return 0;
  }
  if (uv__async_eventfd_no_eventfd2 == '\0') {
    uVar3 = uv__eventfd2(0,0x80800);
    if (uVar3 != 0xffffffff) goto LAB_0059f8c0;
    piVar2 = __errno_location();
    if (*piVar2 != 0x26) {
      uVar3 = -*piVar2;
      goto LAB_0059f8c0;
    }
    uv__async_eventfd_no_eventfd2 = '\x01';
  }
  uVar3 = 0xffffffda;
  if (uv__async_eventfd_no_eventfd == '\0') {
    uVar1 = uv__eventfd(0);
    if (uVar1 == 0xffffffff) {
      piVar2 = __errno_location();
      if (*piVar2 == 0x26) {
        uv__async_eventfd_no_eventfd = '\x01';
      }
      else {
        uVar3 = -*piVar2;
      }
    }
    else {
      uv__cloexec_ioctl(uVar1,1);
      uv__nonblock_ioctl(uVar1,1);
      uVar3 = uVar1;
    }
  }
LAB_0059f8c0:
  if ((int)uVar3 < 0) {
    if ((uVar3 == 0xffffffda) && (uVar3 = uv__make_pipe((int *)&local_40,0x800), uVar3 == 0)) {
      snprintf(local_38,0x20,"/proc/self/fd/%d",(ulong)local_40);
      uVar1 = uv__open_cloexec(local_38,2);
      uVar3 = 0;
      if (-1 < (int)uVar1) {
        uv__close(local_40);
        uv__close(local_3c);
        uVar3 = 0;
        local_40 = uVar1;
        local_3c = uVar1;
      }
    }
  }
  else {
    local_3c = 0xffffffff;
    local_40 = uVar3;
  }
  if (-1 < (int)uVar3) {
    uv__io_init(&loop->async_io_watcher,uv__async_io,local_40);
    uv__io_start(loop,&loop->async_io_watcher,1);
    loop->async_wfd = local_3c;
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static int uv__async_start(uv_loop_t* loop) {
  int pipefd[2];
  int err;

  if (loop->async_io_watcher.fd != -1)
    return 0;

  err = uv__async_eventfd();
  if (err >= 0) {
    pipefd[0] = err;
    pipefd[1] = -1;
  }
  else if (err == -ENOSYS) {
    err = uv__make_pipe(pipefd, UV__F_NONBLOCK);
#if defined(__linux__)
    /* Save a file descriptor by opening one of the pipe descriptors as
     * read/write through the procfs.  That file descriptor can then
     * function as both ends of the pipe.
     */
    if (err == 0) {
      char buf[32];
      int fd;

      snprintf(buf, sizeof(buf), "/proc/self/fd/%d", pipefd[0]);
      fd = uv__open_cloexec(buf, O_RDWR);
      if (fd >= 0) {
        uv__close(pipefd[0]);
        uv__close(pipefd[1]);
        pipefd[0] = fd;
        pipefd[1] = fd;
      }
    }
#endif
  }

  if (err < 0)
    return err;

  uv__io_init(&loop->async_io_watcher, uv__async_io, pipefd[0]);
  uv__io_start(loop, &loop->async_io_watcher, POLLIN);
  loop->async_wfd = pipefd[1];

  return 0;
}